

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

index_type __thiscall
anon_unknown.dwarf_399f32::TransformSelectorIndexes::NormalizeIndex
          (TransformSelectorIndexes *this,index_type index,size_t count)

{
  transform_error *this_00;
  unsigned_long local_48;
  string local_40;
  size_t local_20;
  size_t count_local;
  index_type index_local;
  TransformSelectorIndexes *this_local;
  
  count_local = index;
  if (index < 0) {
    count_local = count + index;
  }
  if ((-1 < (long)count_local) && (count_local < count)) {
    return count_local;
  }
  local_20 = count;
  index_local = (index_type)this;
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  local_48 = local_20 - 1;
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>
            (&local_40,(char (*) [33])"sub-command TRANSFORM, selector ",
             &(this->super_TransformSelector).Tag,(char (*) [10])", index: ",(long *)&count_local,
             (char (*) [17])" out of range (-",&local_20,(char (*) [3])0x10612d1,&local_48,
             (char (*) [3])0x10467dd);
  cmList::transform_error::transform_error(this_00,&local_40);
  __cxa_throw(this_00,&cmList::transform_error::typeinfo,cmList::transform_error::~transform_error);
}

Assistant:

index_type NormalizeIndex(index_type index, std::size_t count)
  {
    if (index < 0) {
      index = static_cast<index_type>(count) + index;
    }
    if (index < 0 || count <= static_cast<std::size_t>(index)) {
      throw transform_error(cmStrCat(
        "sub-command TRANSFORM, selector ", this->Tag, ", index: ", index,
        " out of range (-", count, ", ", count - 1, ")."));
    }
    return index;
  }